

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * __thiscall
Diligent::GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)::
VarTypeToLiteralNameMap::Get(Diligent::SHADER_RESOURCE_VARIABLE_TYPE_bool__const
          (void *this,SHADER_RESOURCE_VARIABLE_TYPE VarType,bool bGetFullName)

{
  const_reference ppcVar1;
  Char *Message;
  array<const_char_*,_3UL> *local_60;
  undefined1 local_40 [8];
  string msg;
  bool bGetFullName_local;
  SHADER_RESOURCE_VARIABLE_TYPE VarType_local;
  VarTypeToLiteralNameMap *this_local;
  
  msg.field_2._M_local_buf[0xe] = bGetFullName;
  msg.field_2._M_local_buf[0xf] = VarType;
  if (VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES) {
    local_60 = (array<const_char_*,_3UL> *)this;
    if (bGetFullName) {
      local_60 = (array<const_char_*,_3UL> *)((long)this + 0x18);
    }
    ppcVar1 = std::array<const_char_*,_3UL>::operator[](local_60,(ulong)VarType);
    this_local = (VarTypeToLiteralNameMap *)*ppcVar1;
  }
  else {
    FormatString<char[29]>((string *)local_40,(char (*) [29])"Unknown shader variable type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x350);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (VarTypeToLiteralNameMap *)0x45cfb0;
  }
  return (Char *)this_local;
}

Assistant:

const Char* Get(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName) const
        {
            if (VarType >= SHADER_RESOURCE_VARIABLE_TYPE_STATIC && VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES)
                return (bGetFullName ? FullVarTypeNameStrings : ShortVarTypeNameStrings)[VarType];
            else
            {
                UNEXPECTED("Unknown shader variable type");
                return "unknown";
            }
        }